

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

void __thiscall
QHttpHeadersPrivate::values(QHttpHeadersPrivate *this,HeaderName *name,QList<QByteArray> *result)

{
  Header *h;
  Header *pHVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool __ret;
  anon_class_16_2_9763bfdf local_50;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->headers).d.size;
  if (lVar2 != 0) {
    pHVar1 = (this->headers).d.ptr;
    lVar2 = lVar2 * 0x38;
    do {
      local_39 = true;
      local_50.__ret = &local_39;
      local_50.__lhs = (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar1;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(name->data).
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                      + 0x18) + 1]._M_data)(&local_50,&name->data);
      if (local_39 == true) {
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                  ((QMovableArrayOps<QByteArray> *)result,(result->d).size,&pHVar1->value);
        QList<QByteArray>::end(result);
      }
      pHVar1 = pHVar1 + 1;
      lVar2 = lVar2 + -0x38;
    } while (lVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeadersPrivate::values(const HeaderName &name, QList<QByteArray> &result) const
{
    for (const auto &h : std::as_const(headers)) {
        if (h.name == name)
            result.append(h.value);
    }
}